

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pushOntoSorter(Parse *pParse,SortCtx *pSort,Select *pSelect,int regData,int regOrigData,
                   int nData,int nPrefixReg)

{
  int iStart;
  int iVar1;
  ExprList *pList;
  Vdbe *p;
  int iVar2;
  int iVar3;
  KeyInfo *pKVar4;
  int p1;
  int iVar5;
  int target;
  int p1_00;
  int iVar6;
  int nBase;
  int iVar7;
  char cVar8;
  uint uVar9;
  Op *pOVar10;
  
  uVar9 = pSort->sortFlags & 1;
  pList = pSort->pOrderBy;
  iVar3 = pList->nExpr;
  iVar6 = (uVar9 ^ 1) + iVar3;
  nBase = nData + iVar6;
  iStart = pSort->nOBSat;
  if (nPrefixReg == 0) {
    target = pParse->nMem + 1;
    pParse->nMem = pParse->nMem + nBase;
  }
  else {
    target = regData - nPrefixReg;
  }
  if (pSelect->iOffset == 0) {
    p1 = pSelect->iLimit;
  }
  else {
    p1 = pSelect->iOffset + 1;
  }
  p = pParse->pVdbe;
  iVar5 = pParse->nLabel + -1;
  pParse->nLabel = iVar5;
  pSort->labelDone = iVar5;
  sqlite3ExprCodeExprList(pParse,pList,target,regOrigData,(regOrigData != 0) * '\x04' + '\x01');
  cVar8 = (char)uVar9;
  if (cVar8 == '\0') {
    sqlite3VdbeAddOp2(p,0x7e,pSort->iECursor,iVar3 + target);
  }
  if (0 < nData && nPrefixReg == 0) {
    sqlite3ExprCodeMove(pParse,regData,iVar6 + target,nData);
  }
  iVar6 = 0;
  if (0 < iStart) {
    iVar6 = makeSorterRecord(pParse,pSort,pSelect,target,nBase);
    iVar5 = pSort->nOBSat;
    iVar7 = pParse->nMem + 1;
    pParse->nMem = iVar5 + pParse->nMem;
    if (cVar8 == '\0') {
      iVar2 = iVar3 + target;
      iVar1 = 0x11;
    }
    else {
      iVar2 = pSort->iECursor;
      iVar1 = 0x78;
    }
    iVar2 = sqlite3VdbeAddOp1(p,iVar1,iVar2);
    sqlite3VdbeAddOp3(p,0x5a,iVar7,target,pSort->nOBSat);
    if (p->db->mallocFailed == '\0') {
      pOVar10 = p->aOp + pSort->addrSortIndex;
    }
    else {
      pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    if (pParse->db->mallocFailed != '\0') {
      return;
    }
    pOVar10->p2 = nBase - iVar5;
    pKVar4 = (pOVar10->p4).pKeyInfo;
    memset(pKVar4->aSortFlags,0,(ulong)pKVar4->nKeyField);
    sqlite3VdbeChangeP4(p,-1,(char *)pKVar4,-8);
    pKVar4 = sqlite3KeyInfoFromExprList
                       (pParse,pSort->pOrderBy,iStart,
                        ~(uint)pKVar4->nKeyField + (uint)pKVar4->nAllField);
    (pOVar10->p4).pKeyInfo = pKVar4;
    iVar1 = p->nOp;
    iVar5 = iVar1 + 1;
    sqlite3VdbeAddOp3(p,0xe,iVar5,0,iVar5);
    iVar5 = pParse->nLabel + -1;
    pParse->nLabel = iVar5;
    pSort->labelBkOut = iVar5;
    p1_00 = pParse->nMem + 1;
    pParse->nMem = p1_00;
    pSort->regReturn = p1_00;
    sqlite3VdbeAddOp2(p,10,p1_00,iVar5);
    sqlite3VdbeAddOp1(p,0x92,pSort->iECursor);
    if (p1 != 0) {
      sqlite3VdbeAddOp2(p,0x11,p1,pSort->labelDone);
    }
    sqlite3VdbeJumpHere(p,iVar2);
    sqlite3ExprCodeMove(pParse,target,iVar7,pSort->nOBSat);
    sqlite3VdbeJumpHere(p,iVar1);
  }
  iVar5 = 0;
  if (p1 != 0) {
    iVar7 = pSort->iECursor;
    sqlite3VdbeAddOp2(p,0x3c,p1,p->nOp + 4);
    sqlite3VdbeAddOp2(p,0x20,iVar7,0);
    iVar5 = sqlite3VdbeAddOp4Int(p,0x28,iVar7,0,target + iStart,iVar3 - iStart);
    sqlite3VdbeAddOp1(p,0x82,iVar7);
  }
  if (iVar6 == 0) {
    iVar6 = makeSorterRecord(pParse,pSort,pSelect,target,nBase);
  }
  sqlite3VdbeAddOp4Int
            (p,pSort->sortFlags & 1 | 0x8a,pSort->iECursor,iVar6,target + iStart,nBase - iStart);
  if (iVar5 != 0) {
    iVar3 = pSort->labelOBLopt;
    if (iVar3 == 0) {
      iVar3 = p->nOp;
    }
    if (p->db->mallocFailed == '\0') {
      pOVar10 = p->aOp + iVar5;
    }
    else {
      pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar10->p2 = iVar3;
  }
  return;
}

Assistant:

static void pushOntoSorter(
  Parse *pParse,         /* Parser context */
  SortCtx *pSort,        /* Information about the ORDER BY clause */
  Select *pSelect,       /* The whole SELECT statement */
  int regData,           /* First register holding data to be sorted */
  int regOrigData,       /* First register holding data before packing */
  int nData,             /* Number of elements in the regData data array */
  int nPrefixReg         /* No. of reg prior to regData available for use */
){
  Vdbe *v = pParse->pVdbe;                         /* Stmt under construction */
  int bSeq = ((pSort->sortFlags & SORTFLAG_UseSorter)==0);
  int nExpr = pSort->pOrderBy->nExpr;              /* No. of ORDER BY terms */
  int nBase = nExpr + bSeq + nData;                /* Fields in sorter record */
  int regBase;                                     /* Regs for sorter record */
  int regRecord = 0;                               /* Assembled sorter record */
  int nOBSat = pSort->nOBSat;                      /* ORDER BY terms to skip */
  int op;                            /* Opcode to add sorter record to sorter */
  int iLimit;                        /* LIMIT counter */
  int iSkip = 0;                     /* End of the sorter insert loop */

  assert( bSeq==0 || bSeq==1 );

  /* Three cases:
  **   (1) The data to be sorted has already been packed into a Record
  **       by a prior OP_MakeRecord.  In this case nData==1 and regData
  **       will be completely unrelated to regOrigData.
  **   (2) All output columns are included in the sort record.  In that
  **       case regData==regOrigData.
  **   (3) Some output columns are omitted from the sort record due to
  **       the SQLITE_ENABLE_SORTER_REFERENCES optimization, or due to the
  **       SQLITE_ECEL_OMITREF optimization, or due to the
  **       SortCtx.pDeferredRowLoad optimization.  In any of these cases
  **       regOrigData is 0 to prevent this routine from trying to copy
  **       values that might not yet exist.
  */
  assert( nData==1 || regData==regOrigData || regOrigData==0 );

#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  pSort->addrPush = sqlite3VdbeCurrentAddr(v);
#endif

  if( nPrefixReg ){
    assert( nPrefixReg==nExpr+bSeq );
    regBase = regData - nPrefixReg;
  }else{
    regBase = pParse->nMem + 1;
    pParse->nMem += nBase;
  }
  assert( pSelect->iOffset==0 || pSelect->iLimit!=0 );
  iLimit = pSelect->iOffset ? pSelect->iOffset+1 : pSelect->iLimit;
  pSort->labelDone = sqlite3VdbeMakeLabel(pParse);
  sqlite3ExprCodeExprList(pParse, pSort->pOrderBy, regBase, regOrigData,
                          SQLITE_ECEL_DUP | (regOrigData? SQLITE_ECEL_REF : 0));
  if( bSeq ){
    sqlite3VdbeAddOp2(v, OP_Sequence, pSort->iECursor, regBase+nExpr);
  }
  if( nPrefixReg==0 && nData>0 ){
    sqlite3ExprCodeMove(pParse, regData, regBase+nExpr+bSeq, nData);
  }
  if( nOBSat>0 ){
    int regPrevKey;   /* The first nOBSat columns of the previous row */
    int addrFirst;    /* Address of the OP_IfNot opcode */
    int addrJmp;      /* Address of the OP_Jump opcode */
    VdbeOp *pOp;      /* Opcode that opens the sorter */
    int nKey;         /* Number of sorting key columns, including OP_Sequence */
    KeyInfo *pKI;     /* Original KeyInfo on the sorter table */

    regRecord = makeSorterRecord(pParse, pSort, pSelect, regBase, nBase);
    regPrevKey = pParse->nMem+1;
    pParse->nMem += pSort->nOBSat;
    nKey = nExpr - pSort->nOBSat + bSeq;
    if( bSeq ){
      addrFirst = sqlite3VdbeAddOp1(v, OP_IfNot, regBase+nExpr);
    }else{
      addrFirst = sqlite3VdbeAddOp1(v, OP_SequenceTest, pSort->iECursor);
    }
    VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_Compare, regPrevKey, regBase, pSort->nOBSat);
    pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
    if( pParse->db->mallocFailed ) return;
    pOp->p2 = nKey + nData;
    pKI = pOp->p4.pKeyInfo;
    memset(pKI->aSortFlags, 0, pKI->nKeyField); /* Makes OP_Jump testable */
    sqlite3VdbeChangeP4(v, -1, (char*)pKI, P4_KEYINFO);
    testcase( pKI->nAllField > pKI->nKeyField+2 );
    pOp->p4.pKeyInfo = sqlite3KeyInfoFromExprList(pParse,pSort->pOrderBy,nOBSat,
                                           pKI->nAllField-pKI->nKeyField-1);
    pOp = 0; /* Ensure pOp not used after sqlite3VdbeAddOp3() */
    addrJmp = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp3(v, OP_Jump, addrJmp+1, 0, addrJmp+1); VdbeCoverage(v);
    pSort->labelBkOut = sqlite3VdbeMakeLabel(pParse);
    pSort->regReturn = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, pSort->iECursor);
    if( iLimit ){
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, pSort->labelDone);
      VdbeCoverage(v);
    }
    sqlite3VdbeJumpHere(v, addrFirst);
    sqlite3ExprCodeMove(pParse, regBase, regPrevKey, pSort->nOBSat);
    sqlite3VdbeJumpHere(v, addrJmp);
  }
  if( iLimit ){
    /* At this point the values for the new sorter entry are stored
    ** in an array of registers. They need to be composed into a record
    ** and inserted into the sorter if either (a) there are currently
    ** less than LIMIT+OFFSET items or (b) the new record is smaller than
    ** the largest record currently in the sorter. If (b) is true and there
    ** are already LIMIT+OFFSET items in the sorter, delete the largest
    ** entry before inserting the new one. This way there are never more
    ** than LIMIT+OFFSET items in the sorter.
    **
    ** If the new record does not need to be inserted into the sorter,
    ** jump to the next iteration of the loop. If the pSort->labelOBLopt
    ** value is not zero, then it is a label of where to jump.  Otherwise,
    ** just bypass the row insert logic.  See the header comment on the
    ** sqlite3WhereOrderByLimitOptLabel() function for additional info.
    */
    int iCsr = pSort->iECursor;
    sqlite3VdbeAddOp2(v, OP_IfNotZero, iLimit, sqlite3VdbeCurrentAddr(v)+4);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Last, iCsr, 0);
    iSkip = sqlite3VdbeAddOp4Int(v, OP_IdxLE,
                                 iCsr, 0, regBase+nOBSat, nExpr-nOBSat);
    VdbeCoverage(v);
    sqlite3VdbeAddOp1(v, OP_Delete, iCsr);
  }
  if( regRecord==0 ){
    regRecord = makeSorterRecord(pParse, pSort, pSelect, regBase, nBase);
  }
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    op = OP_SorterInsert;
  }else{
    op = OP_IdxInsert;
  }
  sqlite3VdbeAddOp4Int(v, op, pSort->iECursor, regRecord,
                       regBase+nOBSat, nBase-nOBSat);
  if( iSkip ){
    sqlite3VdbeChangeP2(v, iSkip,
         pSort->labelOBLopt ? pSort->labelOBLopt : sqlite3VdbeCurrentAddr(v));
  }
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  pSort->addrPushEnd = sqlite3VdbeCurrentAddr(v)-1;
#endif
}